

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::parse_true
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  undefined8 in_RDX;
  json_errc __args;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  ser_context *in_RDI;
  error_code *in_stack_ffffffffffffffd8;
  
  __args = (json_errc)((ulong)in_RDX >> 0x20);
  in_RDI[0xb]._vptr_ser_context = in_RDI[9]._vptr_ser_context;
  if ((long)in_RDI[0xd]._vptr_ser_context - (long)in_RDI[0xe]._vptr_ser_context < 4) {
    in_RDI[0xe]._vptr_ser_context = (_func_int **)((long)in_RDI[0xe]._vptr_ser_context + 1);
    in_RDI[9]._vptr_ser_context = (_func_int **)((long)in_RDI[9]._vptr_ser_context + 1);
    *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 0x15;
  }
  else if (((*(char *)((long)in_RDI[0xe]._vptr_ser_context + 1) == 'r') &&
           (*(char *)((long)in_RDI[0xe]._vptr_ser_context + 2) == 'u')) &&
          (*(char *)((long)in_RDI[0xe]._vptr_ser_context + 3) == 'e')) {
    in_RDI[0xe]._vptr_ser_context = (_func_int **)((long)in_RDI[0xe]._vptr_ser_context + 4);
    in_RDI[9]._vptr_ser_context = (_func_int **)((long)in_RDI[9]._vptr_ser_context + 4);
    basic_json_visitor<char>::bool_value
              ((basic_json_visitor<char> *)in_RSI,SUB81((ulong)in_RDX >> 0x38,0),
               (semantic_tag)((ulong)in_RDX >> 0x30),in_RDI,in_stack_ffffffffffffffd8);
    if (*(int *)&in_RDI[6]._vptr_ser_context == 0) {
      *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 2;
    }
    else {
      *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 7;
    }
    *(byte *)((long)&in_RDI[0xf]._vptr_ser_context + 3) =
         (*(byte *)((long)&in_RDI[0xf]._vptr_ser_context + 5) ^ 0xff) & 1;
  }
  else {
    std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
              (in_RSI,__args,in_RDI);
    std::error_code::operator=((error_code *)in_RSI,__args);
    *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 3) = 0;
  }
  return;
}

Assistant:

void parse_true(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        begin_position_ = position_;
        if (JSONCONS_LIKELY(end_input_ - input_ptr_ >= 4))
        {
            if (*(input_ptr_+1) == 'r' && *(input_ptr_+2) == 'u' && *(input_ptr_+3) == 'e')
            {
                input_ptr_ += 4;
                position_ += 4;
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                if (level_ == 0)
                {
                    state_ = parse_state::accept;
                }
                else
                {
                    state_ = parse_state::expect_comma_or_end;
                }
                more_ = !cursor_mode_;
            }
            else
            {
                err_handler_(json_errc::invalid_value, *this);
                ec = json_errc::invalid_value;
                more_ = false;
                return;
            }
        }
        else
        {
            ++input_ptr_;
            ++position_;
            state_ = parse_state::t;
        }
    }